

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QVariant * __thiscall
QMap<QUrl,_QVariant>::value(QMap<QUrl,_QVariant> *this,QUrl *key,QVariant *defaultValue)

{
  bool bVar1;
  pointer ppVar2;
  QVariant *in_RCX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>
  *in_stack_ffffffffffffffa8;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
                      *)0x7befa6);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
                  *)0x7befd4);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>::
         find(in_stack_ffffffffffffffa8,(key_type *)0x7befe5);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
                  *)0x7beff4);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>::
         cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_QUrl,_QVariant>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_QUrl,_QVariant>_> *)0x7bf024);
      ::QVariant::QVariant(in_RDI,&ppVar2->second);
    }
    else {
      ::QVariant::QVariant(in_RDI,in_RCX);
    }
  }
  else {
    ::QVariant::QVariant(in_RDI,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }